

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cxx
# Opt level: O1

void __thiscall
trento::Event::compute_reduced_thickness<double(*)(double,double)>
          (Event *this,_func_double_double_double *gen_mean)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  double dVar10;
  undefined8 in_XMM4_Qb;
  undefined8 uVar11;
  
  if (this->nsteps_ < 1) {
    auVar8 = ZEXT816(0);
    dVar10 = 0.0;
  }
  else {
    auVar9 = ZEXT1664(ZEXT816(0));
    dVar10 = 0.0;
    lVar3 = 0;
    do {
      uVar11 = in_XMM4_Qb;
      if (0 < this->nsteps_) {
        lVar2 = 0;
        do {
          dVar1 = this->norm_;
          dVar4 = (*gen_mean)((this->TA_).super_multi_array_ref<double,_2UL>.
                              super_const_multi_array_ref<double,_2UL,_double_*>.base_
                              [(this->TA_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
                               (this->TA_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems
                               [0] * lVar3 +
                               (this->TA_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems
                               [1] * lVar2],
                              (this->TB_).super_multi_array_ref<double,_2UL>.
                              super_const_multi_array_ref<double,_2UL,_double_*>.base_
                              [(this->TB_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
                               (this->TB_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems
                               [0] * lVar3 +
                               (this->TB_).super_multi_array_ref<double,_2UL>.
                               super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems
                               [1] * lVar2]);
          dVar4 = dVar4 * dVar1;
          (this->TR_).super_multi_array_ref<double,_2UL>.
          super_const_multi_array_ref<double,_2UL,_double_*>.base_
          [(this->TR_).super_multi_array_ref<double,_2UL>.
           super_const_multi_array_ref<double,_2UL,_double_*>.origin_offset_ +
           (this->TR_).super_multi_array_ref<double,_2UL>.
           super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[0] * lVar3 +
           (this->TR_).super_multi_array_ref<double,_2UL>.
           super_const_multi_array_ref<double,_2UL,_double_*>.stride_list_.elems[1] * lVar2] = dVar4
          ;
          dVar10 = dVar10 + dVar4;
          auVar7._0_8_ = (double)(int)lVar2;
          auVar7._8_8_ = uVar11;
          auVar8._8_8_ = in_XMM4_Qb;
          auVar8._0_8_ = (double)(int)lVar3;
          auVar8 = vunpcklpd_avx(auVar7,auVar8);
          auVar5._8_8_ = dVar4;
          auVar5._0_8_ = dVar4;
          auVar8 = vfmadd231pd_fma(auVar9._0_16_,auVar8,auVar5);
          auVar9 = ZEXT1664(auVar8);
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->nsteps_);
      }
      auVar8 = auVar9._0_16_;
      lVar3 = lVar3 + 1;
      in_XMM4_Qb = uVar11;
    } while (lVar3 < this->nsteps_);
  }
  this->multiplicity_ = dVar10 * this->dxy_ * this->dxy_;
  auVar6._8_8_ = dVar10;
  auVar6._0_8_ = dVar10;
  auVar8 = vdivpd_avx(auVar8,auVar6);
  this->ixcm_ = (double)auVar8._0_8_;
  this->iycm_ = (double)auVar8._8_8_;
  return;
}

Assistant:

void Event::compute_reduced_thickness(GenMean gen_mean) {
  double sum = 0.;
  double ixcm = 0.;
  double iycm = 0.;

  for (int iy = 0; iy < nsteps_; ++iy) {
    for (int ix = 0; ix < nsteps_; ++ix) {
      auto t = norm_ * gen_mean(TA_[iy][ix], TB_[iy][ix]);
      TR_[iy][ix] = t;
      sum += t;
      // Center of mass grid indices.
      // No need to multiply by dxy since it would be canceled later.
      ixcm += t * static_cast<double>(ix);
      iycm += t * static_cast<double>(iy);
    }
  }

  multiplicity_ = dxy_ * dxy_ * sum;
  ixcm_ = ixcm / sum;
  iycm_ = iycm / sum;
}